

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O1

int __thiscall Fl_Text_Display::vline_length(Fl_Text_Display *this,int visLineNum)

{
  int iVar1;
  int pos;
  int iVar2;
  int iVar3;
  
  iVar2 = 0;
  if ((-1 < visLineNum) && (iVar2 = 0, visLineNum < this->mNVisibleLines)) {
    iVar1 = this->mLineStarts[(uint)visLineNum];
    if (iVar1 != -1) {
      if (((int)(visLineNum + 1U) < this->mNVisibleLines) &&
         (pos = this->mLineStarts[visLineNum + 1U], pos != -1)) {
        iVar2 = Fl_Text_Buffer::prev_char(this->mBuffer,pos);
        iVar3 = wrap_uses_character(this,iVar2);
        if (iVar3 == 0) {
          iVar2 = pos;
        }
      }
      else {
        iVar2 = this->mLastChar;
      }
      iVar2 = iVar2 - iVar1;
    }
  }
  return iVar2;
}

Assistant:

int Fl_Text_Display::vline_length( int visLineNum ) const {
  int nextLineStart, lineStartPos;

  if (visLineNum < 0 || visLineNum >= mNVisibleLines)
    return (0);

  lineStartPos = mLineStarts[ visLineNum ];

  if ( lineStartPos == -1 )
    return 0;

  if ( visLineNum + 1 >= mNVisibleLines )
    return mLastChar - lineStartPos;

  nextLineStart = mLineStarts[ visLineNum + 1 ];
  if ( nextLineStart == -1 )
    return mLastChar - lineStartPos;

  int nextLineStartMinus1 = buffer()->prev_char(nextLineStart);
  if (wrap_uses_character(nextLineStartMinus1))
    return nextLineStartMinus1 - lineStartPos;

  return nextLineStart - lineStartPos;
}